

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testStringReplace(void)

{
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> SStack_68;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_48;
  String title;
  
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (&title,"contains: < (less-than) > (greater-than) & (ampersand)",0xffffffffffffffff);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_48,"<");
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&SStack_68,"&lt;");
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace(&title,&local_48,&SStack_68)
  ;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&SStack_68);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_48);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_48,">");
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&SStack_68,"&gt;");
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace(&title,&local_48,&SStack_68)
  ;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&SStack_68);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_48);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_48,"&");
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&SStack_68,"&amp;")
  ;
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace(&title,&local_48,&SStack_68)
  ;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&SStack_68);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_48);
  if (title.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0) {
    title.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
         &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("title = %s\n",title.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&title.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  return;
}

Assistant:

void
testStringReplace() {
	sl::String title = "contains: < (less-than) > (greater-than) & (ampersand)";
	title.replace("<", "&lt;");
	title.replace(">", "&gt;");
	title.replace("&", "&amp;");

	printf("title = %s\n", title.sz());
}